

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mesh.cpp
# Opt level: O1

void __thiscall
pbrt::TriangleMesh::TriangleMesh
          (TriangleMesh *this,Transform *renderFromObject,bool reverseOrientation,
          vector<int,_std::allocator<int>_> *indices,
          vector<pbrt::Point3<float>,_std::allocator<pbrt::Point3<float>_>_> *p,
          vector<pbrt::Vector3<float>,_std::allocator<pbrt::Vector3<float>_>_> *s,
          vector<pbrt::Normal3<float>,_std::allocator<pbrt::Normal3<float>_>_> n,
          vector<pbrt::Point2<float>,_std::allocator<pbrt::Point2<float>_>_> uv,
          vector<int,_std::allocator<int>_> faceIndices)

{
  float fVar1;
  float fVar2;
  float fVar3;
  undefined4 uVar4;
  undefined8 uVar5;
  pointer pPVar6;
  long lVar7;
  ulong *puVar8;
  pointer pVVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  bool bVar13;
  int iVar14;
  Point3f *pt;
  int *piVar15;
  pointer pPVar16;
  Point3<float> *pPVar17;
  Point2<float> *pPVar18;
  ulong *puVar19;
  Normal3<float> *pNVar20;
  pointer pVVar21;
  Vector3<float> *pVVar22;
  ulong uVar23;
  char *args_1;
  vector<pbrt::Point3<float>,_std::allocator<pbrt::Point3<float>_>_> *__range1;
  long in_FS_OFFSET;
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  int vb;
  size_type va;
  vector<pbrt::Vector3<float>,_std::allocator<pbrt::Vector3<float>_>_> *local_38;
  
  uVar23 = (long)(indices->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                 super__Vector_impl_data._M_finish -
           (long)(indices->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                 super__Vector_impl_data._M_start >> 2;
  iVar14 = (int)(uVar23 / 3);
  this->nTriangles = iVar14;
  this->nVertices =
       (int)((ulong)((long)(p->
                           super__Vector_base<pbrt::Point3<float>,_std::allocator<pbrt::Point3<float>_>_>
                           )._M_impl.super__Vector_impl_data._M_finish -
                    (long)(p->
                          super__Vector_base<pbrt::Point3<float>,_std::allocator<pbrt::Point3<float>_>_>
                          )._M_impl.super__Vector_impl_data._M_start) >> 2) * -0x55555555;
  this->vertexIndices = (int *)0x0;
  this->p = (Point3f *)0x0;
  this->n = (Normal3f *)0x0;
  this->s = (Vector3f *)0x0;
  this->n = (Normal3f *)0x0;
  this->s = (Vector3f *)0x0;
  this->uv = (Point2f *)0x0;
  this->faceIndices = (int *)0x0;
  va = uVar23 % 3;
  vb = 0;
  local_38 = s;
  if (va != 0) {
    LogFatal<char_const(&)[21],char_const(&)[2],char_const(&)[21],unsigned_long&,char_const(&)[2],int&>
              (Fatal,
               "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/mesh.cpp"
               ,0x1c,"Check failed: %s == %s with %s = %s, %s = %s",
               (char (*) [21])"(indices.size() % 3)",(char (*) [2])0x28e1834,
               (char (*) [21])"(indices.size() % 3)",&va,(char (*) [2])0x28e1834,&vb);
  }
  *(long *)(in_FS_OFFSET + -0x4d8) = *(long *)(in_FS_OFFSET + -0x4d8) + 1;
  *(long *)(in_FS_OFFSET + -0x4d0) = *(long *)(in_FS_OFFSET + -0x4d0) + (long)iVar14;
  *(long *)(in_FS_OFFSET + -0x4c8) = *(long *)(in_FS_OFFSET + -0x4c8) + 0x40;
  piVar15 = BufferCache<int>::LookupOrAdd(intBufferCache,indices);
  this->vertexIndices = piVar15;
  pPVar6 = (p->super__Vector_base<pbrt::Point3<float>,_std::allocator<pbrt::Point3<float>_>_>).
           _M_impl.super__Vector_impl_data._M_finish;
  for (pPVar16 = (p->super__Vector_base<pbrt::Point3<float>,_std::allocator<pbrt::Point3<float>_>_>)
                 ._M_impl.super__Vector_impl_data._M_start; pPVar16 != pPVar6; pPVar16 = pPVar16 + 1
      ) {
    fVar1 = (pPVar16->super_Tuple3<pbrt::Point3,_float>).x;
    fVar2 = (pPVar16->super_Tuple3<pbrt::Point3,_float>).y;
    fVar3 = (pPVar16->super_Tuple3<pbrt::Point3,_float>).z;
    auVar24 = vfmadd231ss_fma(ZEXT416((uint)(fVar2 * (renderFromObject->m).m[0][1])),
                              ZEXT416((uint)fVar1),ZEXT416((uint)(renderFromObject->m).m[0][0]));
    auVar24 = vfmadd231ss_fma(auVar24,ZEXT416((uint)fVar3),
                              ZEXT416((uint)(renderFromObject->m).m[0][2]));
    fVar10 = auVar24._0_4_ + (renderFromObject->m).m[0][3];
    auVar24 = vfmadd231ss_fma(ZEXT416((uint)(fVar2 * (renderFromObject->m).m[1][1])),
                              ZEXT416((uint)fVar1),ZEXT416((uint)(renderFromObject->m).m[1][0]));
    auVar24 = vfmadd231ss_fma(auVar24,ZEXT416((uint)fVar3),
                              ZEXT416((uint)(renderFromObject->m).m[1][2]));
    fVar11 = auVar24._0_4_ + (renderFromObject->m).m[1][3];
    auVar24 = vfmadd231ss_fma(ZEXT416((uint)(fVar2 * (renderFromObject->m).m[2][1])),
                              ZEXT416((uint)fVar1),ZEXT416((uint)(renderFromObject->m).m[2][0]));
    auVar24 = vfmadd231ss_fma(auVar24,ZEXT416((uint)fVar3),
                              ZEXT416((uint)(renderFromObject->m).m[2][2]));
    fVar12 = auVar24._0_4_ + (renderFromObject->m).m[2][3];
    auVar24 = vfmadd231ss_fma(ZEXT416((uint)(fVar2 * (renderFromObject->m).m[3][1])),
                              ZEXT416((uint)fVar1),ZEXT416((uint)(renderFromObject->m).m[3][0]));
    auVar24 = vfmadd231ss_fma(auVar24,ZEXT416((uint)fVar3),
                              ZEXT416((uint)(renderFromObject->m).m[3][2]));
    fVar1 = auVar24._0_4_ + (renderFromObject->m).m[3][3];
    bVar13 = fVar1 == 1.0;
    auVar24 = vinsertps_avx(ZEXT416((uint)bVar13 * (int)fVar10 +
                                    (uint)!bVar13 * (int)(fVar10 / fVar1)),
                            ZEXT416((uint)bVar13 * (int)fVar11 +
                                    (uint)!bVar13 * (int)(fVar11 / fVar1)),0x10);
    uVar5 = vmovlps_avx(auVar24);
    (pPVar16->super_Tuple3<pbrt::Point3,_float>).x = (float)(int)uVar5;
    (pPVar16->super_Tuple3<pbrt::Point3,_float>).y = (float)(int)((ulong)uVar5 >> 0x20);
    (pPVar16->super_Tuple3<pbrt::Point3,_float>).z =
         (float)((uint)bVar13 * (int)fVar12 + (uint)!bVar13 * (int)(fVar12 / fVar1));
  }
  pPVar17 = BufferCache<pbrt::Point3<float>_>::LookupOrAdd(point3BufferCache,p);
  this->p = pPVar17;
  this->reverseOrientation = reverseOrientation;
  bVar13 = Transform::SwapsHandedness(renderFromObject);
  this->transformSwapsHandedness = bVar13;
  lVar7 = *(long *)&((n.
                      super__Vector_base<pbrt::Normal3<float>,_std::allocator<pbrt::Normal3<float>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish)->
                    super_Tuple3<pbrt::Normal3,_float>).z;
  if (*(long *)&(n.super__Vector_base<pbrt::Normal3<float>,_std::allocator<pbrt::Normal3<float>_>_>.
                 _M_impl.super__Vector_impl_data._M_finish)->super_Tuple3<pbrt::Normal3,_float> !=
      lVar7) {
    vb = this->nVertices;
    va = lVar7 - *(long *)&(n.
                            super__Vector_base<pbrt::Normal3<float>,_std::allocator<pbrt::Normal3<float>_>_>
                            ._M_impl.super__Vector_impl_data._M_finish)->
                           super_Tuple3<pbrt::Normal3,_float> >> 3;
    if (va != (long)vb) {
      LogFatal<char_const(&)[10],char_const(&)[10],char_const(&)[10],int&,char_const(&)[10],unsigned_long&>
                (Fatal,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/mesh.cpp"
                 ,0x2d,"Check failed: %s == %s with %s = %s, %s = %s",(char (*) [10])"nVertices",
                 (char (*) [10])"uv.size()",(char (*) [10])"nVertices",&vb,
                 (char (*) [10])"uv.size()",&va);
    }
    pPVar18 = BufferCache<pbrt::Point2<float>_>::LookupOrAdd
                        (point2BufferCache,
                         (vector<pbrt::Point2<float>,_std::allocator<pbrt::Point2<float>_>_> *)
                         n.
                         super__Vector_base<pbrt::Normal3<float>,_std::allocator<pbrt::Normal3<float>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish);
    this->uv = pPVar18;
  }
  puVar19 = *(ulong **)
             &(n.super__Vector_base<pbrt::Normal3<float>,_std::allocator<pbrt::Normal3<float>_>_>.
               _M_impl.super__Vector_impl_data._M_start)->super_Tuple3<pbrt::Normal3,_float>;
  puVar8 = *(ulong **)
            &((n.super__Vector_base<pbrt::Normal3<float>,_std::allocator<pbrt::Normal3<float>_>_>.
               _M_impl.super__Vector_impl_data._M_start)->super_Tuple3<pbrt::Normal3,_float>).z;
  if (puVar19 != puVar8) {
    vb = this->nVertices;
    va = ((long)puVar8 - (long)puVar19 >> 2) * -0x5555555555555555;
    if (va - (long)vb != 0) {
      args_1 = "n.size()";
      iVar14 = 0x31;
      goto LAB_002c1955;
    }
    for (; puVar19 != puVar8; puVar19 = (ulong *)((long)puVar19 + 0xc)) {
      fVar1 = *(float *)((long)puVar19 + 4);
      auVar24._8_8_ = 0;
      auVar24._0_8_ = *(ulong *)(renderFromObject->mInv).m[0];
      uVar5 = *(undefined8 *)(renderFromObject->mInv).m[1];
      auVar28._8_8_ = 0;
      auVar28._0_8_ = *(ulong *)(renderFromObject->mInv).m[2];
      uVar4 = (undefined4)*puVar19;
      auVar29._4_4_ = uVar4;
      auVar29._0_4_ = uVar4;
      auVar29._8_4_ = uVar4;
      auVar29._12_4_ = uVar4;
      auVar27._0_4_ = fVar1 * (float)uVar5;
      auVar27._4_4_ = fVar1 * (float)((ulong)uVar5 >> 0x20);
      auVar27._8_4_ = fVar1 * 0.0;
      auVar27._12_4_ = fVar1 * 0.0;
      auVar24 = vfmadd231ps_fma(auVar27,auVar29,auVar24);
      uVar4 = (undefined4)puVar19[1];
      auVar25._4_4_ = uVar4;
      auVar25._0_4_ = uVar4;
      auVar25._8_4_ = uVar4;
      auVar25._12_4_ = uVar4;
      auVar24 = vfmadd231ps_fma(auVar24,auVar25,auVar28);
      auVar27 = vfmadd231ss_fma(ZEXT416((uint)(fVar1 * (renderFromObject->mInv).m[1][2])),auVar29,
                                ZEXT416((uint)(renderFromObject->mInv).m[0][2]));
      auVar27 = vfmadd231ss_fma(auVar27,auVar25,ZEXT416((uint)(renderFromObject->mInv).m[2][2]));
      uVar23 = vmovlps_avx(auVar24);
      *puVar19 = uVar23;
      *(uint *)(puVar19 + 1) = auVar27._0_4_;
      if (reverseOrientation) {
        auVar26._0_8_ = *puVar19 ^ 0x8000000080000000;
        auVar26._8_4_ = 0x80000000;
        auVar26._12_4_ = 0x80000000;
        uVar23 = vmovlps_avx(auVar26);
        *puVar19 = uVar23;
        *(uint *)(puVar19 + 1) = auVar27._0_4_ ^ 0x80000000;
      }
    }
    pNVar20 = BufferCache<pbrt::Normal3<float>_>::LookupOrAdd
                        (normal3BufferCache,
                         (vector<pbrt::Normal3<float>,_std::allocator<pbrt::Normal3<float>_>_> *)
                         n.
                         super__Vector_base<pbrt::Normal3<float>,_std::allocator<pbrt::Normal3<float>_>_>
                         ._M_impl.super__Vector_impl_data._M_start);
    this->n = pNVar20;
  }
  pVVar21 = (local_38->
            super__Vector_base<pbrt::Vector3<float>,_std::allocator<pbrt::Vector3<float>_>_>).
            _M_impl.super__Vector_impl_data._M_start;
  pVVar9 = (local_38->
           super__Vector_base<pbrt::Vector3<float>,_std::allocator<pbrt::Vector3<float>_>_>)._M_impl
           .super__Vector_impl_data._M_finish;
  if (pVVar21 != pVVar9) {
    vb = this->nVertices;
    va = ((long)pVVar9 - (long)pVVar21 >> 2) * -0x5555555555555555;
    if (va - (long)vb != 0) {
      args_1 = "s.size()";
      iVar14 = 0x3a;
LAB_002c1955:
      LogFatal<char_const(&)[10],char_const(&)[9],char_const(&)[10],int&,char_const(&)[9],unsigned_long&>
                (Fatal,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/mesh.cpp"
                 ,iVar14,"Check failed: %s == %s with %s = %s, %s = %s",(char (*) [10])"nVertices",
                 (char (*) [9])args_1,(char (*) [10])"nVertices",&vb,(char (*) [9])args_1,&va);
    }
    for (; pVVar21 != pVVar9; pVVar21 = pVVar21 + 1) {
      fVar1 = (pVVar21->super_Tuple3<pbrt::Vector3,_float>).x;
      fVar2 = (pVVar21->super_Tuple3<pbrt::Vector3,_float>).y;
      fVar3 = (pVVar21->super_Tuple3<pbrt::Vector3,_float>).z;
      auVar24 = vfmadd231ss_fma(ZEXT416((uint)(fVar2 * (renderFromObject->m).m[0][1])),
                                ZEXT416((uint)fVar1),ZEXT416((uint)(renderFromObject->m).m[0][0]));
      auVar24 = vfmadd231ss_fma(auVar24,ZEXT416((uint)fVar3),
                                ZEXT416((uint)(renderFromObject->m).m[0][2]));
      auVar27 = vfmadd231ss_fma(ZEXT416((uint)(fVar2 * (renderFromObject->m).m[1][1])),
                                ZEXT416((uint)fVar1),ZEXT416((uint)(renderFromObject->m).m[1][0]));
      auVar27 = vfmadd231ss_fma(auVar27,ZEXT416((uint)fVar3),
                                ZEXT416((uint)(renderFromObject->m).m[1][2]));
      auVar24 = vinsertps_avx(auVar24,auVar27,0x10);
      auVar27 = vfmadd231ss_fma(ZEXT416((uint)(fVar2 * (renderFromObject->m).m[2][1])),
                                ZEXT416((uint)fVar1),ZEXT416((uint)(renderFromObject->m).m[2][0]));
      auVar27 = vfmadd231ss_fma(auVar27,ZEXT416((uint)fVar3),
                                ZEXT416((uint)(renderFromObject->m).m[2][2]));
      uVar5 = vmovlps_avx(auVar24);
      (pVVar21->super_Tuple3<pbrt::Vector3,_float>).x = (float)(int)uVar5;
      (pVVar21->super_Tuple3<pbrt::Vector3,_float>).y = (float)(int)((ulong)uVar5 >> 0x20);
      (pVVar21->super_Tuple3<pbrt::Vector3,_float>).z = auVar27._0_4_;
    }
    pVVar22 = BufferCache<pbrt::Vector3<float>_>::LookupOrAdd(vector3BufferCache,local_38);
    this->s = pVVar22;
  }
  lVar7 = *(long *)&((n.
                      super__Vector_base<pbrt::Normal3<float>,_std::allocator<pbrt::Normal3<float>_>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage)->
                    super_Tuple3<pbrt::Normal3,_float>).z;
  if (*(long *)&(n.super__Vector_base<pbrt::Normal3<float>,_std::allocator<pbrt::Normal3<float>_>_>.
                 _M_impl.super__Vector_impl_data._M_end_of_storage)->
                super_Tuple3<pbrt::Normal3,_float> != lVar7) {
    vb = this->nTriangles;
    va = lVar7 - *(long *)&(n.
                            super__Vector_base<pbrt::Normal3<float>,_std::allocator<pbrt::Normal3<float>_>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage)->
                           super_Tuple3<pbrt::Normal3,_float> >> 2;
    if (va != (long)vb) {
      LogFatal<char_const(&)[11],char_const(&)[19],char_const(&)[11],int&,char_const(&)[19],unsigned_long&>
                (Fatal,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/mesh.cpp"
                 ,0x41,"Check failed: %s == %s with %s = %s, %s = %s",(char (*) [11])"nTriangles",
                 (char (*) [19])"faceIndices.size()",(char (*) [11])"nTriangles",&vb,
                 (char (*) [19])"faceIndices.size()",&va);
    }
    piVar15 = BufferCache<int>::LookupOrAdd
                        (intBufferCache,
                         (vector<int,_std::allocator<int>_> *)
                         n.
                         super__Vector_base<pbrt::Normal3<float>,_std::allocator<pbrt::Normal3<float>_>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage);
    this->faceIndices = piVar15;
  }
  va = ((long)(p->super__Vector_base<pbrt::Point3<float>,_std::allocator<pbrt::Point3<float>_>_>).
              _M_impl.super__Vector_impl_data._M_finish -
        (long)(p->super__Vector_base<pbrt::Point3<float>,_std::allocator<pbrt::Point3<float>_>_>).
              _M_impl.super__Vector_impl_data._M_start >> 2) * -0x5555555555555555;
  vb = 0x7fffffff;
  if ((va & 0xffffffff80000000) != 0) {
    LogFatal<char_const(&)[9],char_const(&)[32],char_const(&)[9],unsigned_long&,char_const(&)[32],int&>
              (Fatal,
               "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/mesh.cpp"
               ,0x47,"Check failed: %s <= %s with %s = %s, %s = %s",(char (*) [9])"p.size()",
               (char (*) [32])"std::numeric_limits<int>::max()",(char (*) [9])"p.size()",&va,
               (char (*) [32])"std::numeric_limits<int>::max()",&vb);
  }
  va = (long)(indices->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
             super__Vector_impl_data._M_finish -
       (long)(indices->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
             super__Vector_impl_data._M_start >> 2;
  vb = 0x7fffffff;
  if ((va & 0xffffffff80000000) != 0) {
    LogFatal<char_const(&)[15],char_const(&)[32],char_const(&)[15],unsigned_long&,char_const(&)[32],int&>
              (Fatal,
               "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/mesh.cpp"
               ,0x4b,"Check failed: %s <= %s with %s = %s, %s = %s",(char (*) [15])"indices.size()",
               (char (*) [32])"std::numeric_limits<int>::max()",(char (*) [15])"indices.size()",&va,
               (char (*) [32])"std::numeric_limits<int>::max()",&vb);
  }
  return;
}

Assistant:

TriangleMesh::TriangleMesh(const Transform &renderFromObject, bool reverseOrientation,
                           std::vector<int> indices, std::vector<Point3f> p,
                           std::vector<Vector3f> s, std::vector<Normal3f> n,
                           std::vector<Point2f> uv, std::vector<int> faceIndices)
    : nTriangles(indices.size() / 3), nVertices(p.size()) {
    CHECK_EQ((indices.size() % 3), 0);
    ++nTriMeshes;
    nTris += nTriangles;
    triangleBytes += sizeof(*this);
    // Initialize mesh _vertexIndices_
    vertexIndices = intBufferCache->LookupOrAdd(indices);

    // Transform mesh vertices to render space and initialize mesh _p_
    for (Point3f &pt : p)
        pt = renderFromObject(pt);
    this->p = point3BufferCache->LookupOrAdd(p);

    // Remainder of _TriangleMesh_ constructor
    this->reverseOrientation = reverseOrientation;
    this->transformSwapsHandedness = renderFromObject.SwapsHandedness();

    if (!uv.empty()) {
        CHECK_EQ(nVertices, uv.size());
        this->uv = point2BufferCache->LookupOrAdd(uv);
    }
    if (!n.empty()) {
        CHECK_EQ(nVertices, n.size());
        for (Normal3f &nn : n) {
            nn = renderFromObject(nn);
            if (reverseOrientation)
                nn = -nn;
        }
        this->n = normal3BufferCache->LookupOrAdd(n);
    }
    if (!s.empty()) {
        CHECK_EQ(nVertices, s.size());
        for (Vector3f &ss : s)
            ss = renderFromObject(ss);
        this->s = vector3BufferCache->LookupOrAdd(s);
    }

    if (!faceIndices.empty()) {
        CHECK_EQ(nTriangles, faceIndices.size());
        this->faceIndices = intBufferCache->LookupOrAdd(faceIndices);
    }

    // Make sure that we don't have too much stuff to be using integers to
    // index into things.
    CHECK_LE(p.size(), std::numeric_limits<int>::max());
    // We could be clever and check indices.size() / 3 if we were careful
    // to promote to a 64-bit int before multiplying by 3 when we look up
    // in the indices array...
    CHECK_LE(indices.size(), std::numeric_limits<int>::max());
}